

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1_int8.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int _c;
  void *pvVar1;
  uint _w;
  ulong uVar2;
  int _w_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  if (outch < 4) {
    _w_00 = _w * 8;
    _c = outch;
  }
  else {
    _w_00 = _w * 0x20;
    _c = ((uint)outch >> 2) * -3 + outch;
  }
  uVar7 = 0;
  Mat::create(kernel_tm,_w_00,inch / 8,_c,1,(Allocator *)0x0);
  uVar2 = (ulong)_w;
  if ((int)_w < 1) {
    uVar2 = uVar7;
  }
  for (; (long)(uVar7 | 3) < (long)outch; uVar7 = uVar7 + 4) {
    pvVar1 = (void *)((uVar7 >> 2) * kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data)
    ;
    for (uVar3 = 0; (long)(uVar3 | 7) < (long)inch; uVar3 = uVar3 + 8) {
      for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
        for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
          for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
            *(undefined1 *)((long)pvVar1 + lVar6) =
                 *(undefined1 *)
                  ((long)local_78.data +
                  uVar4 + (uVar3 + lVar6) * (long)local_78.w * local_78.elemsize +
                          local_78.cstep * (uVar5 | uVar7) * local_78.elemsize);
          }
          pvVar1 = (void *)((long)pvVar1 + 8);
        }
      }
    }
  }
  for (; (long)uVar7 < (long)outch; uVar7 = uVar7 + 1) {
    pvVar1 = (void *)((ulong)(((uint)uVar7 & 3) + ((uint)(uVar7 >> 2) & 0x3fffffff)) *
                      kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
    for (uVar3 = 0; (long)(uVar3 | 7) < (long)inch; uVar3 = uVar3 + 8) {
      for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
        for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
          *(undefined1 *)((long)pvVar1 + lVar6) =
               *(undefined1 *)
                ((long)local_78.data +
                uVar4 + (uVar3 + lVar6) * (long)local_78.w * local_78.elemsize +
                        local_78.cstep * uVar7 * local_78.elemsize);
        }
        pvVar1 = (void *)((long)pvVar1 + 8);
      }
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8a-4b-maxk-inch/8a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    if (outch >= 4)
        kernel_tm.create(32 * maxk, inch / 8, outch / 4 + outch % 4, (size_t)1u);
    else
        kernel_tm.create(8 * maxk, inch / 8, outch, (size_t)1u);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        signed char* g00 = kernel_tm.channel(q / 4);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const signed char* k00 = kernel.channel(q + i).row<const signed char>(p + j);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
    // TODO unroll 2
    for (; q < outch; q++)
    {
        signed char* g00 = kernel_tm.channel(q / 4 + q % 4);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int j = 0; j < 8; j++)
                {
                    const signed char* k00 = kernel.channel(q).row<const signed char>(p + j);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
}